

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O3

int ndiSerialOpen(char *device)

{
  int *piVar1;
  ulong uVar2;
  int __fd;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  bool bVar6;
  termios t;
  termios local_5c;
  
  __fd = open(device,0x902);
  if (__fd != -1) {
    fcntl(__fd,4,0);
    iVar3 = fcntl(__fd,6,&ndiSerialOpen::fl);
    if (iVar3 == 0) {
      iVar3 = tcgetattr(__fd,&local_5c);
      if (iVar3 != -1) {
        if (ndi_open_handles[0] == -1 || ndi_open_handles[0] == __fd) {
          piVar4 = ndi_open_handles;
          bVar6 = true;
          uVar5 = 0;
        }
        else {
          piVar4 = ndi_open_handles;
          uVar2 = 0xffffffffffffffff;
          do {
            uVar5 = uVar2;
            if (uVar5 == 2) {
              uVar5 = 4;
              bVar6 = false;
              goto LAB_0010b8b3;
            }
            piVar1 = piVar4 + 1;
            piVar4 = piVar4 + 1;
          } while ((*piVar1 != __fd) && (uVar2 = uVar5 + 1, *piVar1 != -1));
          bVar6 = uVar5 + 1 < 3;
          uVar5 = uVar5 + 2;
        }
        *piVar4 = __fd;
        tcgetattr(__fd,(termios *)(ndi_save_termios + uVar5));
        uVar5 = uVar5 & 0xffffffff;
LAB_0010b8b3:
        local_5c.c_lflag = 0;
        local_5c.c_iflag = 0;
        local_5c.c_oflag = 0;
        local_5c.c_cc[5] = '2';
        local_5c.c_cc[6] = '\0';
        iVar3 = tcsetattr(__fd,0,&local_5c);
        if (iVar3 != -1) {
          tcflush(__fd,2);
          return __fd;
        }
        if (bVar6) {
          ndi_open_handles[uVar5] = -1;
        }
      }
      fcntl(__fd,6,&ndiSerialOpen::fu);
    }
    close(__fd);
  }
  return -1;
}

Assistant:

ndicapiExport int ndiSerialOpen(const char* device)
{
  static struct flock fl = { F_WRLCK, 0, 0, 0 }; /* for file locking */
  static struct flock fu = { F_UNLCK, 0, 0, 0 }; /* for file unlocking */
  int serial_port;
  struct termios t;
  int i;

  /* port is readable/writable and is (for now) non-blocking */
  serial_port = open(device, O_RDWR | O_NOCTTY | O_NDELAY);

  if (serial_port == -1)
  {
    return -1;             /* bail out on error */
  }

  /* restore blocking now that the port is open (we just didn't want */
  /* the port to block while we were trying to open it) */
  fcntl(serial_port, F_SETFL, 0);

  /* get exclusive lock on the serial port */
  /* on many unices, this has no effect for device files */
  if (fcntl(serial_port, F_SETLK, &fl))
  {
    close(serial_port);
    return -1;
  }

  /* get I/O information */
  if (tcgetattr(serial_port, &t) == -1)
  {
    fcntl(serial_port, F_SETLK, &fu);
    close(serial_port);
    return -1;
  }

  /* save the serial port state so that it can be restored when
     the serial port is closed in ndiSerialClose() */
  for (i = 0; i < NDI_MAX_SAVE_STATE; i++)
  {
    if (ndi_open_handles[i] == serial_port || ndi_open_handles[i] == -1)
    {
      ndi_open_handles[i] = serial_port;
      tcgetattr(serial_port, &ndi_save_termios[i]);
      break;
    }
  }

  /* clear everything specific to terminals */
  t.c_lflag = 0;
  t.c_iflag = 0;
  t.c_oflag = 0;

  t.c_cc[VMIN] = 0;                    /* use constant, not interval timeout */
  t.c_cc[VTIME] = TIMEOUT_PERIOD / 100; /* wait for 5 secs max */

  if (tcsetattr(serial_port, TCSANOW, &t) == -1) /* set I/O information */
  {
    if (i < NDI_MAX_SAVE_STATE)   /* if we saved the state, forget the state */
    {
      ndi_open_handles[i] = -1;
    }
    fcntl(serial_port, F_SETLK, &fu);
    close(serial_port);
    return -1;
  }

  tcflush(serial_port, TCIOFLUSH);        /* flush the buffers for good luck */

  return serial_port;
}